

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbuffer.cpp
# Opt level: O2

bool __thiscall QBuffer::seek(QBuffer *this,qint64 pos)

{
  QObjectData *pQVar1;
  QBindingStatus *this_00;
  bool bVar2;
  HANDLE pvVar3;
  long in_FS_OFFSET;
  QMessageLogger local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QIODevice).super_QObject.d_ptr.d;
  pvVar3 = (pQVar1[4].bindingStorage.bindingStatus)->threadId;
  if ((long)pvVar3 < pos) {
    bVar2 = QIODevice::isWritable(&this->super_QIODevice);
    this_00 = pQVar1[4].bindingStorage.bindingStatus;
    if (!bVar2) {
      pvVar3 = this_00->threadId;
      goto LAB_0020e766;
    }
    QByteArray::resize((QByteArray *)this_00,pos,'\0');
    if ((pQVar1[4].bindingStorage.bindingStatus)->threadId == (HANDLE)pos) goto LAB_0020e76b;
    local_40.context.version = 2;
    local_40.context.function._4_4_ = 0;
    local_40.context._4_8_ = 0;
    local_40.context._12_8_ = 0;
    local_40.context.category = "default";
    QMessageLogger::warning(&local_40,"QBuffer::seek: Unable to fill gap");
  }
  else {
LAB_0020e766:
    if ((ulong)pos <= pvVar3) {
LAB_0020e76b:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        bVar2 = QIODevice::seek(&this->super_QIODevice,pos);
        return bVar2;
      }
      goto LAB_0020e814;
    }
    local_40.context.version = 2;
    local_40.context.function._4_4_ = 0;
    local_40.context._4_8_ = 0;
    local_40.context._12_8_ = 0;
    local_40.context.category = "default";
    QMessageLogger::warning(&local_40,"QBuffer::seek: Invalid pos: %lld",pos);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return false;
  }
LAB_0020e814:
  __stack_chk_fail();
}

Assistant:

bool QBuffer::seek(qint64 pos)
{
    Q_D(QBuffer);
    const auto oldBufSize = d->buf->size();
    constexpr qint64 MaxSeekPos = (std::numeric_limits<decltype(oldBufSize)>::max)();
    if (pos <= MaxSeekPos && pos > oldBufSize && isWritable()) {
        QT_TRY {
            d->buf->resize(qsizetype(pos), '\0');
        } QT_CATCH(const std::bad_alloc &) {} // swallow, failure case is handled below
        if (d->buf->size() != pos) {
            qWarning("QBuffer::seek: Unable to fill gap");
            return false;
        }
    }